

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cc
# Opt level: O2

void __thiscall fizplex::Base::ftran(Base *this,DVector *vec)

{
  double dVar1;
  pointer pEVar2;
  double *pdVar3;
  size_t i;
  ulong i_00;
  vector<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_> *__range1;
  ETM *etm;
  pointer etm_00;
  DVector w;
  DVector local_38;
  
  pEVar2 = (this->etms).super__Vector_base<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (etm_00 = (this->etms).
                super__Vector_base<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_>._M_impl.
                super__Vector_impl_data._M_start; etm_00 != pEVar2; etm_00 = etm_00 + 1) {
    apply_etm(this,etm_00,vec);
  }
  DVector::DVector(&local_38,this->m);
  for (i_00 = 0; i_00 < this->m; i_00 = i_00 + 1) {
    pdVar3 = DVector::operator[](vec,i_00);
    dVar1 = *pdVar3;
    pdVar3 = DVector::operator[](&local_38,
                                 (this->row_ordering)._M_t.
                                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                 .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl[i_00]);
    *pdVar3 = dVar1;
  }
  DVector::operator=(vec,&local_38);
  operator_delete(local_38.vals._M_data);
  return;
}

Assistant:

void Base::ftran(DVector &vec) const {
  for (auto &etm : etms)
    apply_etm(etm, vec);

  // Reorder vec according to base column swaps
  DVector w(m);
  for (size_t i = 0; i < m; i++)
    w[row_ordering[i]] = vec[i];
  vec = w;
}